

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_example_cpp(bool copy_on_write)

{
  bool bVar1;
  ostream *poVar2;
  uint64_t uVar3;
  uint32_t *ans;
  size_t maxbytes;
  char *pcVar4;
  size_t sVar5;
  RoaringSetBitBiDirectionalIterator *pRVar6;
  size_type sVar7;
  fd_set *__writefds;
  size_t __n;
  ulong uVar8;
  uint32_t i;
  uint32_t uVar9;
  fd_set *__exceptfds;
  timeval *__timeout;
  initializer_list<unsigned_int> l;
  initializer_list<unsigned_int> l_00;
  initializer_list<unsigned_int> l_01;
  initializer_list<unsigned_int> l_02;
  uint32_t counter;
  Roaring b;
  Roaring a;
  Roaring r1;
  Roaring r2;
  uint32_t element;
  Roaring r3;
  Roaring rogue;
  Roaring t;
  uint local_1f4 [3];
  Roaring r2id;
  Roaring t2;
  Roaring r1_2_3;
  Roaring bigunion;
  Roaring z;
  Roaring r1f;
  Roaring r2i;
  uint32_t values [3];
  const_iterator j;
  Roaring i1_2;
  uint32_t manyvalues [5];
  Roaring *allmybitmaps [3];
  
  roaring::Roaring::Roaring(&r1);
  r1.roaring.high_low_container.flags = r1.roaring.high_low_container.flags & 0xfe | copy_on_write;
  for (uVar9 = 100; uVar9 != 1000; uVar9 = uVar9 + 1) {
    roaring::Roaring::add(&r1,uVar9);
  }
  bVar1 = roaring::Roaring::contains(&r1,500);
  _assert_true((ulong)bVar1,"r1.contains(500)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x13c);
  roaring::Roaring::cardinality(&r1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cardinality = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  roaring::Roaring::getSizeInBytes(&r1,true);
  roaring::Roaring::runOptimize(&r1);
  roaring::Roaring::getSizeInBytes(&r1,true);
  poVar2 = std::operator<<((ostream *)&std::cout,"size before run optimize ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bytes, and after ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bytes.");
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar4 = (char *)0x5;
  sVar7 = 2;
  __exceptfds = (fd_set *)0x3;
  __timeout = (timeval *)0x5;
  roaring::Roaring::bitmapOf(&r2,5,1);
  roaring::Roaring::printf(&r2,pcVar4);
  putchar(10);
  r2id.roaring.high_low_container.size = 1;
  r2id.roaring.high_low_container.allocation_size = 2;
  r2id.roaring.high_low_container.containers = (container_s **)0x500000003;
  r2id.roaring.high_low_container.keys._0_4_ = 6;
  l._M_len = sVar7;
  l._M_array = (iterator)0x5;
  roaring::Roaring::bitmapOfList(&r2i,&r2id,l);
  bVar1 = roaring::Roaring::operator==(&r2i,&r2);
  _assert_true((ulong)bVar1,"r2i == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x153);
  r3.roaring.high_low_container.size = 1;
  r3.roaring.high_low_container.allocation_size = 2;
  r3.roaring.high_low_container.containers = (container_s **)0x500000003;
  r3.roaring.high_low_container.keys._0_4_ = 6;
  l_00._M_len = 5;
  l_00._M_array = (iterator)&r3;
  roaring::Roaring::Roaring(&r2id,l_00);
  bVar1 = roaring::Roaring::operator==(&r2id,&r2);
  __writefds = (fd_set *)0x158;
  _assert_true((ulong)bVar1,"r2id == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x158);
  roaring::Roaring::select(&r2,3,(fd_set *)&element,__writefds,__exceptfds,__timeout);
  _assert_true((ulong)(element == 5),"element == 5",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x15d);
  uVar9 = roaring::Roaring::minimum(&r2);
  _assert_true((ulong)(uVar9 == 1),"r2.minimum() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x15f);
  uVar9 = roaring::Roaring::maximum(&r2);
  _assert_true((ulong)(uVar9 == 6),"r2.maximum() == 6",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x161);
  uVar3 = roaring::Roaring::rank(&r2,4);
  _assert_true((ulong)(uVar3 == 3),"r2.rank(4) == 3",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x163);
  values[0] = 2;
  values[1] = 3;
  values[2] = 4;
  roaring::Roaring::Roaring(&r3,3,values);
  r3.roaring.high_low_container.flags = r3.roaring.high_low_container.flags & 0xfe | copy_on_write;
  uVar3 = roaring::Roaring::cardinality(&r1);
  ans = (uint32_t *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
  _assert_true(1,"arr1 != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x16d);
  roaring::Roaring::toUint32Array(&r1,ans);
  roaring::Roaring::Roaring(&r1f,uVar3,ans);
  operator_delete__(ans);
  bVar1 = roaring::Roaring::operator==(&r1,&r1f);
  _assert_true((ulong)bVar1,"r1 == r1f",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x173);
  roaring::Roaring::Roaring(&z,&r3);
  z.roaring.high_low_container.flags = z.roaring.high_low_container.flags & 0xfe | copy_on_write;
  bVar1 = roaring::Roaring::operator==(&r3,&z);
  _assert_true((ulong)bVar1,"r3 == z",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x178);
  roaring::Roaring::operator|(&r1_2_3,&r1,&r2);
  r1_2_3.roaring.high_low_container.flags =
       r1_2_3.roaring.high_low_container.flags & 0xfe | copy_on_write;
  roaring::Roaring::operator|=(&r1_2_3,&r3);
  allmybitmaps[0] = &r1;
  allmybitmaps[1] = &r2;
  allmybitmaps[2] = &r3;
  roaring::Roaring::fastunion(&bigunion,3,allmybitmaps);
  bVar1 = roaring::Roaring::operator==(&r1_2_3,&bigunion);
  __n = 0x182;
  _assert_true((ulong)bVar1,"r1_2_3 == bigunion",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x182);
  roaring::Roaring::operator&(&i1_2,&r1,&r2);
  maxbytes = roaring::Roaring::getSizeInBytes(&r1,true);
  pcVar4 = (char *)operator_new__(maxbytes);
  roaring::Roaring::write(&r1,(int)pcVar4,(void *)0x1,__n);
  roaring::Roaring::read((int)&t,pcVar4,1);
  sVar5 = roaring::Roaring::getSizeInBytes(&t,true);
  _assert_true((ulong)(maxbytes == sVar5),"expectedsize == t.getSizeInBytes()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x18c);
  bVar1 = roaring::Roaring::operator==(&r1,&t);
  _assert_true((ulong)bVar1,"r1 == t",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x18d);
  roaring::Roaring::readSafe(&t2,pcVar4,maxbytes);
  sVar5 = roaring::Roaring::getSizeInBytes(&t2,true);
  _assert_true((ulong)(maxbytes == sVar5),"expectedsize == t2.getSizeInBytes()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,400);
  bVar1 = roaring::Roaring::operator==(&r1,&t2);
  _assert_true((ulong)bVar1,"r1 == t2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x191);
  operator_delete__(pcVar4);
  counter = 0;
  roaring_iterate((roaring_bitmap_t *)&r1,roaring_iterator_sumall,&counter);
  counter = 0;
  roaring::Roaring::begin((RoaringSetBitBiDirectionalIterator *)&rogue,&t);
  while( true ) {
    pRVar6 = roaring::Roaring::end(&t);
    if ((rogue.roaring.high_low_container._32_4_ == (pRVar6->i).current_value) &&
       ((bool)rogue.roaring.high_low_container._36_1_ == (pRVar6->i).has_value)) break;
    counter = counter + 1;
    roaring_uint32_iterator_advance((roaring_uint32_iterator_t *)&rogue);
  }
  uVar8 = (ulong)counter;
  uVar3 = roaring::Roaring::cardinality(&t);
  _assert_true((ulong)(uVar3 == uVar8),"counter == t.cardinality()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1a3);
  manyvalues[0] = 2;
  manyvalues[1] = 3;
  manyvalues[2] = 4;
  manyvalues[3] = 7;
  manyvalues[4] = 8;
  roaring::Roaring::Roaring(&rogue,5,manyvalues);
  roaring::Roaring::begin(&j,&rogue);
  roaring_uint32_iterator_move_equalorlarger((roaring_uint32_iterator_t *)&j,4);
  _assert_true((ulong)(j.i.current_value == 4),"*j == 4",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1aa);
  roaring::Roaring::Roaring(&b);
  roaring::Roaring::add(&b,10);
  roaring::Roaring::add(&b,0x14);
  roaring::Roaring::Roaring(&a,&b);
  uVar3 = roaring::Roaring::cardinality(&a);
  _assert_true((ulong)(uVar3 == 2),"a.cardinality() == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1b3);
  bVar1 = roaring::Roaring::contains(&a,10);
  _assert_true((ulong)bVar1,"a.contains(10)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1b4);
  bVar1 = roaring::Roaring::contains(&a,0x14);
  _assert_true((ulong)bVar1,"a.contains(20)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1b5);
  uVar3 = roaring::Roaring::cardinality(&b);
  _assert_true((ulong)(uVar3 == 0),"b.cardinality() == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1b9);
  roaring::Roaring::~Roaring(&a);
  roaring::Roaring::~Roaring(&b);
  roaring::Roaring::Roaring(&b);
  roaring::Roaring::add(&b,10);
  roaring::Roaring::add(&b,0x14);
  roaring::Roaring::Roaring(&a);
  roaring::Roaring::operator=(&a,&b);
  uVar3 = roaring::Roaring::cardinality(&a);
  _assert_int_equal(2,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x1c5);
  bVar1 = roaring::Roaring::contains(&a,10);
  _assert_true((ulong)bVar1,"a.contains(10)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1c6);
  bVar1 = roaring::Roaring::contains(&a,0x14);
  _assert_true((ulong)bVar1,"a.contains(20)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1c7);
  uVar3 = roaring::Roaring::cardinality(&b);
  _assert_int_equal(0,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x1cb);
  roaring::Roaring::~Roaring(&a);
  roaring::Roaring::~Roaring(&b);
  roaring::Roaring::Roaring(&b);
  roaring::Roaring::add(&b,10);
  roaring::Roaring::add(&b,0x14);
  local_1f4[0] = 10;
  local_1f4[1] = 0x14;
  l_01._M_len = 2;
  l_01._M_array = local_1f4;
  roaring::Roaring::Roaring(&a,l_01);
  bVar1 = roaring::Roaring::operator==(&b,&a);
  _assert_true((ulong)bVar1,"a == b",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1d6);
  roaring::Roaring::add(&b,0x1e);
  local_1f4[0] = 10;
  local_1f4[1] = 0x14;
  local_1f4[2] = 0x1e;
  l_02._M_len = 3;
  l_02._M_array = local_1f4;
  roaring::Roaring::operator=(&a,l_02);
  bVar1 = roaring::Roaring::operator==(&b,&a);
  _assert_true((ulong)bVar1,"a == b",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1db);
  roaring::Roaring::~Roaring(&a);
  roaring::Roaring::~Roaring(&b);
  roaring::Roaring::Roaring(&b);
  roaring::Roaring::add(&b,1);
  roaring::Roaring::add(&b,2);
  roaring::Roaring::add(&b,3);
  roaring::Roaring::add(&b,4);
  roaring::Roaring::toString_abi_cxx11_((string *)&a,&b);
  _assert_string_equal
            ("{1,2,3,4}",(char *)a.roaring.high_low_container._0_8_,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
             ,0x1e6);
  std::__cxx11::string::~string((string *)&a);
  roaring::Roaring::~Roaring(&b);
  roaring::Roaring::~Roaring(&rogue);
  roaring::Roaring::~Roaring(&t2);
  roaring::Roaring::~Roaring(&t);
  roaring::Roaring::~Roaring(&i1_2);
  roaring::Roaring::~Roaring(&bigunion);
  roaring::Roaring::~Roaring(&r1_2_3);
  roaring::Roaring::~Roaring(&z);
  roaring::Roaring::~Roaring(&r1f);
  roaring::Roaring::~Roaring(&r3);
  roaring::Roaring::~Roaring(&r2id);
  roaring::Roaring::~Roaring(&r2i);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  return;
}

Assistant:

void test_example_cpp(bool copy_on_write) {
    // create a new empty bitmap
    Roaring r1;
    r1.setCopyOnWrite(copy_on_write);
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        r1.add(i);
    }

    // check whether a value is contained
    assert_true(r1.contains(500));

    // compute how many bits there are:
    uint64_t cardinality = r1.cardinality();
    std::cout << "Cardinality = " << cardinality << std::endl;

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    size_t size = r1.getSizeInBytes();
    r1.runOptimize();
    size_t compact_size = r1.getSizeInBytes();

    std::cout << "size before run optimize " << size << " bytes, and after "
              << compact_size << " bytes." << std::endl;

    // create a new bitmap with varargs
    Roaring r2 = Roaring::bitmapOf(5, 1, 2, 3, 5, 6);

    r2.printf();
    printf("\n");
    // create a new bitmap with initializer list
    Roaring r2i = Roaring::bitmapOfList({1, 2, 3, 5, 6});

    assert_true(r2i == r2);

    // create a new bitmap directly from initializer list
    Roaring r2id = {1, 2, 3, 5, 6};

    assert_true(r2id == r2);

    // test select
    uint32_t element;
    r2.select(3, &element);
    assert_true(element == 5);

    assert_true(r2.minimum() == 1);

    assert_true(r2.maximum() == 6);

    assert_true(r2.rank(4) == 3);

    // we can also create a bitmap from a pointer to 32-bit integers
    const uint32_t values[] = {2, 3, 4};
    Roaring r3(3, values);
    r3.setCopyOnWrite(copy_on_write);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = r1.cardinality();
    uint32_t *arr1 = new uint32_t[card1];
    assert_true(arr1 != NULL);
    r1.toUint32Array(arr1);
    Roaring r1f(card1, arr1);
    delete[] arr1;

    // bitmaps shall be equal
    assert_true(r1 == r1f);

    // we can copy and compare bitmaps
    Roaring z(r3);
    z.setCopyOnWrite(copy_on_write);
    assert_true(r3 == z);

    // we can compute union two-by-two
    Roaring r1_2_3 = r1 | r2;
    r1_2_3.setCopyOnWrite(copy_on_write);
    r1_2_3 |= r3;

    // we can compute a big union
    const Roaring *allmybitmaps[] = {&r1, &r2, &r3};
    Roaring bigunion = Roaring::fastunion(3, allmybitmaps);
    assert_true(r1_2_3 == bigunion);

    // we can compute intersection two-by-two
    Roaring i1_2 = r1 & r2;

    // we can write a bitmap to a pointer and recover it later
    size_t expectedsize = r1.getSizeInBytes();
    char *serializedbytes = new char[expectedsize];
    r1.write(serializedbytes);
    Roaring t = Roaring::read(serializedbytes);
    assert_true(expectedsize == t.getSizeInBytes());
    assert_true(r1 == t);

    Roaring t2 = Roaring::readSafe(serializedbytes, expectedsize);
    assert_true(expectedsize == t2.getSizeInBytes());
    assert_true(r1 == t2);

    delete[] serializedbytes;

    // we can iterate over all values using custom functions
    uint32_t counter = 0;
    r1.iterate(roaring_iterator_sumall, &counter);
    /**
     * void roaring_iterator_sumall(uint32_t value, void *param) {
     *        *(uint32_t *) param += value;
     *  }
     *
     */
    // we can also iterate the C++ way
    counter = 0;
    for (Roaring::const_iterator i = t.begin(); i != t.end(); i++) {
        ++counter;
    }
    assert_true(counter == t.cardinality());

    // we can move iterators
    const uint32_t manyvalues[] = {2, 3, 4, 7, 8};
    Roaring rogue(5, manyvalues);
    Roaring::const_iterator j = rogue.begin();
    j.move_equalorlarger(4);
    assert_true(*j == 4);

    // test move constructor
    {
        Roaring b;
        b.add(10);
        b.add(20);

        Roaring a(std::move(b));
        assert_true(a.cardinality() == 2);
        assert_true(a.contains(10));
        assert_true(a.contains(20));

        // Our move semantics allow moved-from objects to continue to be used
        // normally (they are reset to empty Roarings).
        assert_true(b.cardinality() == 0);
    }

    // test move operator
    {
        Roaring b;
        b.add(10);
        b.add(20);

        Roaring a;

        a = std::move(b);
        assert_int_equal(2, a.cardinality());
        assert_true(a.contains(10));
        assert_true(a.contains(20));

        // Our move semantics allow moved-from objects to continue to be used
        // normally (they are reset to empty Roarings).
        assert_int_equal(0, b.cardinality());
    }

    // test initializer lists
    {
        Roaring a;
        a.add(10);
        a.add(20);

        // construction
        Roaring b({10, 20});
        assert_true(a == b);

        a.add(30);
        // assignment
        b = {10, 20, 30};
        assert_true(a == b);
    }

    // test toString
    {
        Roaring a;
        a.add(1);
        a.add(2);
        a.add(3);
        a.add(4);

        assert_string_equal("{1,2,3,4}", a.toString().c_str());
    }
}